

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O1

String * __thiscall stick::ArgumentParser::help(String *__return_storage_ptr__,ArgumentParser *this)

{
  Size SVar1;
  Size SVar2;
  char *pcVar3;
  ulong uVar4;
  ArgumentParser *pAVar5;
  String *pSVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar8;
  ArgumentParser *pAVar9;
  long lVar10;
  Argument *pAVar11;
  String *pSVar12;
  String local_108;
  String local_e8;
  char *local_c8;
  Size SStack_c0;
  Size local_b8;
  Allocator *local_b0;
  char *local_a8;
  Size SStack_a0;
  Size local_98;
  DefaultAllocator *local_90;
  char *local_88;
  Size SStack_80;
  Size local_78;
  DefaultAllocator *local_70;
  ArgumentParser *local_60;
  ulong local_58;
  char *local_50;
  long local_48;
  String *local_40;
  char *local_38;
  
  usage(__return_storage_ptr__,this);
  SVar1 = (this->m_info).m_length;
  if (SVar1 != 0) {
    local_c8 = (char *)0x0;
    local_b8 = 0;
    local_b0 = (this->m_info).m_allocator;
    SStack_c0 = SVar1;
    if ((this->m_info).m_cStr != (char *)0x0) {
      iVar7 = (*local_b0->_vptr_Allocator[2])(local_b0,SVar1 + 1,1);
      local_c8 = (char *)CONCAT44(extraout_var,iVar7);
      memset(local_c8,0,SVar1 + 1);
      if (local_c8 == (char *)0x0) {
LAB_0010d8fa:
        __assert_fail("m_cStr != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                      ,0x1a0,"void stick::String::reserve(Size)");
      }
      local_b8 = SVar1;
      strcpy(local_c8,(this->m_info).m_cStr);
    }
    String::append<char_const*,stick::String,char_const*>(__return_storage_ptr__,"\n",&local_c8);
    if (local_c8 != (char *)0x0) {
      local_48 = local_b8 + 1;
      local_50 = local_c8;
      (*local_b0->_vptr_Allocator[3])();
      local_c8 = (char *)0x0;
      SStack_c0 = 0;
      local_b8 = 0;
    }
  }
  local_40 = __return_storage_ptr__;
  if ((this->m_args).m_count != 0) {
    if (this->m_requiredCount != 0) {
      String::append(__return_storage_ptr__,"\nRequired arguments:\n");
      SVar1 = (this->m_args).m_count;
      local_60 = this;
      if (SVar1 != 0) {
        pAVar11 = (Argument *)(this->m_args).m_data.ptr;
        lVar10 = SVar1 * 0x90;
        do {
          if (pAVar11->bOptional == false) {
            SVar1 = (pAVar11->shortName).m_length;
            if (SVar1 != 0) {
              SVar2 = __return_storage_ptr__->m_length;
              uVar8 = SVar1 + SVar2;
              if ((__return_storage_ptr__->m_capacity < uVar8) &&
                 (uVar4 = uVar8 * 2, __return_storage_ptr__->m_capacity < uVar4)) {
                local_38 = __return_storage_ptr__->m_cStr;
                local_58 = uVar4;
                iVar7 = (*__return_storage_ptr__->m_allocator->_vptr_Allocator[2])
                                  (__return_storage_ptr__->m_allocator,uVar4 | 1,1);
                __return_storage_ptr__ = local_40;
                local_40->m_cStr = (char *)CONCAT44(extraout_var_00,iVar7);
                memset((char *)CONCAT44(extraout_var_00,iVar7),0,uVar4 | 1);
                if (__return_storage_ptr__->m_cStr == (char *)0x0) goto LAB_0010d8fa;
                if (local_38 != (char *)0x0) {
                  strcpy(__return_storage_ptr__->m_cStr,local_38);
                  local_48 = __return_storage_ptr__->m_capacity + 1;
                  local_50 = local_38;
                  (*__return_storage_ptr__->m_allocator->_vptr_Allocator[3])
                            (__return_storage_ptr__->m_allocator,&local_50);
                }
                __return_storage_ptr__->m_capacity = local_58;
              }
              __return_storage_ptr__->m_length = uVar8;
              strcpy(__return_storage_ptr__->m_cStr + SVar2,(pAVar11->shortName).m_cStr);
            }
            if ((pAVar11->name).m_length != 0) {
              if ((pAVar11->shortName).m_length != 0) {
                String::append(__return_storage_ptr__,", ");
              }
              SVar1 = (pAVar11->name).m_length;
              if (SVar1 != 0) {
                SVar2 = __return_storage_ptr__->m_length;
                uVar8 = SVar1 + SVar2;
                if ((__return_storage_ptr__->m_capacity < uVar8) &&
                   (uVar4 = uVar8 * 2, __return_storage_ptr__->m_capacity < uVar4)) {
                  local_38 = __return_storage_ptr__->m_cStr;
                  local_58 = uVar4;
                  iVar7 = (*__return_storage_ptr__->m_allocator->_vptr_Allocator[2])
                                    (__return_storage_ptr__->m_allocator,uVar4 | 1,1);
                  __return_storage_ptr__ = local_40;
                  local_40->m_cStr = (char *)CONCAT44(extraout_var_01,iVar7);
                  memset((char *)CONCAT44(extraout_var_01,iVar7),0,uVar4 | 1);
                  if (__return_storage_ptr__->m_cStr == (char *)0x0) goto LAB_0010d8fa;
                  if (local_38 != (char *)0x0) {
                    strcpy(__return_storage_ptr__->m_cStr,local_38);
                    local_48 = __return_storage_ptr__->m_capacity + 1;
                    local_50 = local_38;
                    (*__return_storage_ptr__->m_allocator->_vptr_Allocator[3])
                              (__return_storage_ptr__->m_allocator,&local_50);
                  }
                  __return_storage_ptr__->m_capacity = local_58;
                }
                __return_storage_ptr__->m_length = uVar8;
                strcpy(__return_storage_ptr__->m_cStr + SVar2,(pAVar11->name).m_cStr);
              }
            }
            detail::argumentSignature(&local_108,pAVar11);
            SVar1 = (pAVar11->info).m_length;
            if (SVar1 == 0) {
              if (defaultAllocator()::m_def == '\0') {
                help();
              }
              local_a8 = (char *)0x0;
              SStack_a0 = 0;
              local_98 = 0;
              local_90 = defaultAllocator::m_def;
            }
            else {
              local_a8 = (char *)0x0;
              local_98 = 0;
              local_90 = (DefaultAllocator *)(pAVar11->info).m_allocator;
              SStack_a0 = SVar1;
              if ((pAVar11->info).m_cStr != (char *)0x0) {
                iVar7 = (*(local_90->super_Allocator)._vptr_Allocator[2])(local_90,SVar1 + 1,1);
                local_a8 = (char *)CONCAT44(extraout_var_02,iVar7);
                memset(local_a8,0,SVar1 + 1);
                if (local_a8 == (char *)0x0) goto LAB_0010d8fa;
                local_98 = SVar1;
                strcpy(local_a8,(pAVar11->info).m_cStr);
                __return_storage_ptr__ = local_40;
              }
            }
            String::append<char_const*,stick::String,char_const*,stick::String,char_const*>
                      (__return_storage_ptr__," ",&local_108,"    ",&local_a8,"\n");
            if (local_a8 != (char *)0x0) {
              local_48 = local_98 + 1;
              local_50 = local_a8;
              (*(local_90->super_Allocator)._vptr_Allocator[3])(local_90,&local_50);
              local_a8 = (char *)0x0;
              SStack_a0 = 0;
              local_98 = 0;
            }
            if (local_108.m_cStr != (char *)0x0) {
              local_48 = local_108.m_capacity + 1;
              local_50 = local_108.m_cStr;
              (*(local_108.m_allocator)->_vptr_Allocator[3])(local_108.m_allocator,&local_50);
              local_108.m_cStr = (char *)0x0;
              local_108.m_length = 0;
              local_108.m_capacity = 0;
            }
          }
          pAVar11 = pAVar11 + 1;
          lVar10 = lVar10 + -0x90;
        } while (lVar10 != 0);
      }
      String::append(__return_storage_ptr__,"\n");
      this = local_60;
    }
    if (this->m_requiredCount < (this->m_args).m_count) {
      String::append(local_40,"Optional arguments:\n");
      SVar1 = (this->m_args).m_count;
      if (SVar1 != 0) {
        pAVar11 = (Argument *)(this->m_args).m_data.ptr;
        lVar10 = SVar1 * 0x90;
        do {
          pSVar6 = local_40;
          if (pAVar11->bOptional == true) {
            SVar1 = (pAVar11->shortName).m_length;
            if (SVar1 != 0) {
              SVar2 = local_40->m_length;
              pAVar9 = (ArgumentParser *)(SVar1 + SVar2);
              pSVar12 = local_40;
              if (((ArgumentParser *)local_40->m_capacity < pAVar9) &&
                 (pAVar5 = (ArgumentParser *)((long)pAVar9 * 2),
                 (ArgumentParser *)local_40->m_capacity < pAVar5)) {
                local_38 = local_40->m_cStr;
                local_58 = (ulong)pAVar5 | 1;
                local_60 = pAVar5;
                iVar7 = (*local_40->m_allocator->_vptr_Allocator[2])
                                  (local_40->m_allocator,local_58,1);
                pSVar6->m_cStr = (char *)CONCAT44(extraout_var_03,iVar7);
                memset((char *)CONCAT44(extraout_var_03,iVar7),0,local_58);
                pSVar12 = local_40;
                pcVar3 = pSVar6->m_cStr;
                if (pcVar3 == (char *)0x0) goto LAB_0010d8fa;
                if (local_38 != (char *)0x0) {
                  strcpy(pcVar3,local_38);
                  local_48 = pSVar12->m_capacity + 1;
                  local_50 = local_38;
                  (*pSVar12->m_allocator->_vptr_Allocator[3])(pSVar12->m_allocator,&local_50);
                }
                pSVar12->m_capacity = (Size)local_60;
              }
              pSVar12->m_length = (Size)pAVar9;
              strcpy(pSVar12->m_cStr + SVar2,(pAVar11->shortName).m_cStr);
            }
            if ((pAVar11->name).m_length != 0) {
              if ((pAVar11->shortName).m_length != 0) {
                String::append(local_40,", ");
              }
              pSVar6 = local_40;
              SVar1 = (pAVar11->name).m_length;
              if (SVar1 != 0) {
                SVar2 = local_40->m_length;
                pAVar9 = (ArgumentParser *)(SVar1 + SVar2);
                pSVar12 = local_40;
                if (((ArgumentParser *)local_40->m_capacity < pAVar9) &&
                   (pAVar5 = (ArgumentParser *)((long)pAVar9 * 2),
                   (ArgumentParser *)local_40->m_capacity < pAVar5)) {
                  local_38 = local_40->m_cStr;
                  local_58 = (ulong)pAVar5 | 1;
                  local_60 = pAVar5;
                  iVar7 = (*local_40->m_allocator->_vptr_Allocator[2])
                                    (local_40->m_allocator,local_58,1);
                  pSVar6->m_cStr = (char *)CONCAT44(extraout_var_04,iVar7);
                  memset((char *)CONCAT44(extraout_var_04,iVar7),0,local_58);
                  pSVar12 = local_40;
                  pcVar3 = pSVar6->m_cStr;
                  if (pcVar3 == (char *)0x0) goto LAB_0010d8fa;
                  if (local_38 != (char *)0x0) {
                    strcpy(pcVar3,local_38);
                    local_48 = pSVar12->m_capacity + 1;
                    local_50 = local_38;
                    (*pSVar12->m_allocator->_vptr_Allocator[3])(pSVar12->m_allocator,&local_50);
                  }
                  pSVar12->m_capacity = (Size)local_60;
                }
                pSVar12->m_length = (Size)pAVar9;
                strcpy(pSVar12->m_cStr + SVar2,(pAVar11->name).m_cStr);
              }
            }
            detail::argumentSignature(&local_e8,pAVar11);
            SVar1 = (pAVar11->info).m_length;
            if (SVar1 == 0) {
              if (defaultAllocator()::m_def == '\0') {
                help();
              }
              local_88 = (char *)0x0;
              SStack_80 = 0;
              local_78 = 0;
              local_70 = defaultAllocator::m_def;
            }
            else {
              local_88 = (char *)0x0;
              local_78 = 0;
              local_70 = (DefaultAllocator *)(pAVar11->info).m_allocator;
              SStack_80 = SVar1;
              if ((pAVar11->info).m_cStr != (char *)0x0) {
                iVar7 = (*(local_70->super_Allocator)._vptr_Allocator[2])(local_70,SVar1 + 1,1);
                local_88 = (char *)CONCAT44(extraout_var_05,iVar7);
                memset(local_88,0,SVar1 + 1);
                if (local_88 == (char *)0x0) goto LAB_0010d8fa;
                local_78 = SVar1;
                strcpy(local_88,(pAVar11->info).m_cStr);
              }
            }
            String::append<char_const*,stick::String,char_const*,stick::String,char_const*>
                      (local_40," ",&local_e8,"    ",&local_88,"\n");
            if (local_88 != (char *)0x0) {
              local_48 = local_78 + 1;
              local_50 = local_88;
              (*(local_70->super_Allocator)._vptr_Allocator[3])(local_70,&local_50);
              local_88 = (char *)0x0;
              SStack_80 = 0;
              local_78 = 0;
            }
            if (local_e8.m_cStr != (char *)0x0) {
              local_48 = local_e8.m_capacity + 1;
              local_50 = local_e8.m_cStr;
              (*(local_e8.m_allocator)->_vptr_Allocator[3])(local_e8.m_allocator,&local_50);
              local_e8.m_cStr = (char *)0x0;
              local_e8.m_length = 0;
              local_e8.m_capacity = 0;
            }
          }
          pAVar11 = pAVar11 + 1;
          lVar10 = lVar10 + -0x90;
        } while (lVar10 != 0);
      }
    }
  }
  return local_40;
}

Assistant:

String ArgumentParser::help() const
{
    String ret = usage();

    if (m_info.length())
        ret.append(AppendVariadicFlag(), "\n", m_info, "\n");

    if (m_args.count())
    {
        if (m_requiredCount)
        {
            ret.append("\nRequired arguments:\n");
            for (auto & arg : m_args)
            {
                if (!arg.bOptional)
                {
                    if (arg.shortName.length())
                        ret.append(arg.shortName);
                    if (arg.name.length())
                    {
                        if (arg.shortName.length())
                            ret.append(", ");
                        ret.append(arg.name);
                    }
                    ret.append(AppendVariadicFlag(),
                               " ",
                               detail::argumentSignature(arg),
                               "    ",
                               arg.info.length() ? arg.info : "",
                               "\n");
                }
            }
            ret.append("\n");
        }
        if (m_args.count() > m_requiredCount)
        {
            ret.append("Optional arguments:\n");
            for (auto & arg : m_args)
            {
                if (arg.bOptional)
                {
                    if (arg.shortName.length())
                        ret.append(arg.shortName);
                    if (arg.name.length())
                    {
                        if (arg.shortName.length())
                            ret.append(", ");
                        ret.append(arg.name);
                    }
                    ret.append(AppendVariadicFlag(),
                               " ",
                               detail::argumentSignature(arg),
                               "    ",
                               arg.info.length() ? arg.info : "",
                               "\n");
                }
            }
        }
    }

    return ret;
}